

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.cxx
# Opt level: O2

int __thiscall cmValue::Compare(cmValue *this,string_view value)

{
  string *psVar1;
  int iVar2;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  psVar1 = this->Value;
  if (psVar1 == (string *)0x0) {
    return -(uint)(value._M_str != (char *)0x0);
  }
  if (value._M_str != (char *)0x0) {
    local_10._M_str = (psVar1->_M_dataplus)._M_p;
    local_10._M_len = psVar1->_M_string_length;
    iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_10,value);
    return iVar2;
  }
  return 1;
}

Assistant:

int cmValue::Compare(cm::string_view value) const noexcept
{
  if (this->Value == nullptr && value.data() == nullptr) {
    return 0;
  }
  if (this->Value == nullptr) {
    return -1;
  }
  if (value.data() == nullptr) {
    return 1;
  }
  return cm::string_view(*this->Value).compare(value);
}